

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::AddMessage
          (V2TransportTester *this,string *m_type,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *payload)

{
  long in_FS_OFFSET;
  CSerializedNetMsg msg;
  CSerializedNetMsg local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_type._M_dataplus._M_p = (pointer)&local_58.m_type.field_2;
  local_58.m_type._M_string_length = 0;
  local_58.m_type.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_58.m_type,m_type);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&local_58.data,payload)
  ;
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::emplace_back<CSerializedNetMsg>
            (&this->m_msg_to_send,&local_58);
  CSerializedNetMsg::~CSerializedNetMsg(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddMessage(std::string m_type, std::vector<uint8_t> payload)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(m_type);
        msg.data = std::move(payload);
        m_msg_to_send.push_back(std::move(msg));
    }